

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DExporter::AttrHelper_Color3ToAttrList
          (X3DExporter *this,
          list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
          *pList,string *pName,aiColor3D *pValue,aiColor3D *pDefaultValue)

{
  bool bVar1;
  value_type local_a0;
  uint local_60;
  undefined1 local_50 [8];
  string tstr;
  aiColor3D *pDefaultValue_local;
  aiColor3D *pValue_local;
  string *pName_local;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  *pList_local;
  X3DExporter *this_local;
  
  tstr.field_2._8_8_ = pDefaultValue;
  std::__cxx11::string::string((string *)local_50);
  bVar1 = aiColor3D::operator==(pValue,(aiColor3D *)tstr.field_2._8_8_);
  if (!bVar1) {
    AttrHelper_Col3DArrToString(this,pValue,1,(string *)local_50);
    std::__cxx11::string::string((string *)&local_a0,(string *)pName);
    std::__cxx11::string::string((string *)&local_a0.Value,(string *)local_50);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    push_back(pList,&local_a0);
    SAttribute::~SAttribute(&local_a0);
  }
  local_60 = (uint)bVar1;
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void X3DExporter::AttrHelper_Color3ToAttrList(std::list<SAttribute>& pList, const std::string& pName, const aiColor3D& pValue, const aiColor3D& pDefaultValue)
{
string tstr;

	if(pValue == pDefaultValue) return;

	AttrHelper_Col3DArrToString(&pValue, 1, tstr);
	pList.push_back({pName, tstr});
}